

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O2

Geodesic *
Geodesic::getGeodesicNoCommonEdges(Geodesic *__return_storage_ptr__,PhyloTree *t1,PhyloTree *t2)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges2;
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  unsigned_long uVar4;
  pointer puVar5;
  BipartiteGraph *pBVar6;
  size_type __n;
  size_type __n_00;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *pvVar7;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  long lVar9;
  PhyloTreeEdge *ratio_e_edge;
  long lVar10;
  pointer pPVar11;
  int i;
  ulong uVar12;
  pointer puVar13;
  pointer puVar14;
  int iVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> aVertices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bVertices;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  cover;
  RatioSequence rs;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> ratio_e_edges;
  Ratio r1;
  Ratio ratio;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> ratio_f_edges;
  vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
  incidenceMatrix;
  Ratio r2;
  deque<Ratio,_std::allocator<Ratio>_> queue;
  BipartiteGraph bg;
  Ratio local_70;
  
  pPVar1 = (t1->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar11 = (t1->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar9 = (long)pPVar11 - (long)pPVar1;
  __n = lVar9 / 0x48;
  pPVar2 = (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar3 = (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = (long)pPVar3 - (long)pPVar2;
  __n_00 = lVar10 / 0x48;
  if (__n_00 == 0 && __n == 0) {
    RatioSequence::RatioSequence((RatioSequence *)&bg);
    Geodesic(__return_storage_ptr__,(RatioSequence *)&bg);
    pBVar6 = &bg;
  }
  else {
    if ((pPVar11 == pPVar1) || (pPVar3 == pPVar2)) {
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      PhyloTree::getNewick_abi_cxx11_((string *)&ratio,t1,true);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queue,
                     "Error: tried to compute geodesic between subtrees that should not have common/compatible edges, but do!  t1 = "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ratio);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&queue,
                     " and t2 = ");
      PhyloTree::getNewick_abi_cxx11_((string *)&r1,t2,true);
      std::operator+(__return_storage_ptr___00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&r1);
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    edges1 = &t1->edges;
    edges2 = &t2->edges;
    std::
    __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    std::
    __sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
               .super__Vector_impl_data._M_start,
               (t2->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
               .super__Vector_impl_data._M_finish);
    RatioSequence::RatioSequence(&rs);
    if (lVar9 == 0x48 || lVar10 == 0x48) {
      Ratio::Ratio(&local_70,edges1,edges2);
      RatioSequence::push_back_value(&rs,&local_70);
      Ratio::~Ratio(&local_70);
      Geodesic(__return_storage_ptr__,&rs);
    }
    else {
      aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Deque_base<Ratio,_std::allocator<Ratio>_>::_Deque_base
                (&queue.super__Deque_base<Ratio,_std::allocator<Ratio>_>);
      Ratio::Ratio(&ratio);
      BipartiteGraph::getIncidenceMatrix(&incidenceMatrix,edges1,edges2);
      PhyloTree::getIntEdgeAttribNorms((vector<double,_std::allocator<double>_> *)&r1,t1);
      PhyloTree::getIntEdgeAttribNorms((vector<double,_std::allocator<double>_> *)&r2,t2);
      BipartiteGraph::BipartiteGraph
                (&bg,&incidenceMatrix,(vector<double,_std::allocator<double>_> *)&r1,
                 (vector<double,_std::allocator<double>_> *)&r2);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&r2);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&r1);
      std::deque<Ratio,std::allocator<Ratio>>::
      emplace_back<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>&>
                ((deque<Ratio,std::allocator<Ratio>> *)&queue,edges1,edges2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&aVertices,__n);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&bVertices,__n_00);
      while( true ) {
        if (queue.super__Deque_base<Ratio,_std::allocator<Ratio>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            queue.super__Deque_base<Ratio,_std::allocator<Ratio>_>._M_impl.super__Deque_impl_data.
            _M_start._M_cur) break;
        Ratio::operator=(&ratio,queue.super__Deque_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                super__Deque_impl_data._M_start._M_cur);
        std::deque<Ratio,_std::allocator<Ratio>_>::pop_front(&queue);
        if (aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        pvVar7 = Ratio::getEEdges(&ratio);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&ratio_e_edges,pvVar7);
        pvVar7 = Ratio::getFEdges(&ratio);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&ratio_f_edges,pvVar7);
        pPVar1 = ratio_e_edges.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pPVar11 = ratio_e_edges.
                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                       super__Vector_impl_data._M_start; pPVar11 != pPVar1; pPVar11 = pPVar11 + 1) {
          _Var8 = std::
                  __lower_bound<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,PhyloTreeEdge,__gnu_cxx::__ops::_Iter_less_val>
                            ((t1->edges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (t1->edges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish,pPVar11);
          r1.eLength = (double)(((long)_Var8._M_current -
                                (long)(edges1->
                                      super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                      )._M_impl.super__Vector_impl_data._M_start) / 0x48);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&aVertices,(unsigned_long *)&r1);
        }
        lVar9 = 0;
        uVar12 = 0;
        while( true ) {
          pvVar7 = Ratio::getFEdges(&ratio);
          if ((ulong)(((long)(pvVar7->
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar7->
                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar12) break;
          _Var8 = std::
                  __lower_bound<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,PhyloTreeEdge,__gnu_cxx::__ops::_Iter_less_val>
                            ((t2->edges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (t2->edges).
                             super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish,
                             (long)&((ratio_f_edges.
                                      super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_Bipartition)
                                    ._vptr_Bipartition + lVar9);
          r1.eLength = (double)(((long)_Var8._M_current -
                                (long)(edges2->
                                      super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                      )._M_impl.super__Vector_impl_data._M_start) / 0x48);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&bVertices,(unsigned_long *)&r1);
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x48;
        }
        BipartiteGraph::vertex_cover(&cover,&bg,&aVertices,&bVertices);
        uVar4 = *((cover.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((uVar4 == 0) ||
           (uVar4 == (long)aVertices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)aVertices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3)) {
          RatioSequence::push_back(&rs,&ratio);
        }
        else {
          Ratio::Ratio(&r1);
          Ratio::Ratio(&r2);
          puVar14 = aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          iVar15 = 0;
          for (puVar13 = aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              puVar5 = bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish, puVar13 != puVar14;
              puVar13 = puVar13 + 1) {
            uVar4 = *puVar13;
            puVar5 = cover.
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (((ulong)(long)iVar15 <
                 (ulong)((long)cover.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3)) &&
               (uVar4 == puVar5[iVar15])) {
              Ratio::addEEdge(&r1,(edges1->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
              iVar15 = iVar15 + 1;
            }
            else {
              Ratio::addEEdge(&r2,(edges1->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
            }
          }
          iVar15 = 0;
          for (puVar14 = bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar5;
              puVar14 = puVar14 + 1) {
            uVar4 = *puVar14;
            puVar13 = cover.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (((ulong)(long)iVar15 <
                 (ulong)((long)cover.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[3].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar13 >> 3)) &&
               (uVar4 == puVar13[iVar15])) {
              Ratio::addFEdge(&r2,(edges2->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
              iVar15 = iVar15 + 1;
            }
            else {
              Ratio::addFEdge(&r1,(edges2->
                                  super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + uVar4);
            }
          }
          std::deque<Ratio,_std::allocator<Ratio>_>::push_front(&queue,&r2);
          std::deque<Ratio,_std::allocator<Ratio>_>::push_front(&queue,&r1);
          Ratio::~Ratio(&r2);
          Ratio::~Ratio(&r1);
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&cover);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&ratio_f_edges);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&ratio_e_edges);
      }
      Geodesic(__return_storage_ptr__,&rs);
      BipartiteGraph::~BipartiteGraph(&bg);
      std::
      vector<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
      ::~vector(&incidenceMatrix);
      Ratio::~Ratio(&ratio);
      std::deque<Ratio,_std::allocator<Ratio>_>::~deque(&queue);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&bVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&aVertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    pBVar6 = (BipartiteGraph *)&rs;
  }
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector
            ((vector<Ratio,_std::allocator<Ratio>_> *)
             &(pBVar6->edge).
              super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

Geodesic Geodesic::getGeodesicNoCommonEdges(PhyloTree &t1, PhyloTree &t2) {
    auto& t1_edges = t1.edges;
    auto& t2_edges = t2.edges;
    size_t numEdges1 = t1_edges.size(); // number of edges in tree 1
    size_t numEdges2 = t2_edges.size(); // number of edges in tree 2

    if (numEdges1 == 0 && numEdges2 == 0)
        return Geodesic(RatioSequence());

    // double-check that both trees have splits.  Otherwise didn't remove a common edge.
    if (numEdges1 == 0 || numEdges2 == 0) {
        throw ("Error: tried to compute geodesic between subtrees that should not have common/compatible edges, but do!  t1 = " + t1.getNewick(true) + " and t2 = " + t2.getNewick(true));
    }

    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    // double-check no common edges
//    vector<PhyloTreeEdge> commonEdges;
//    PhyloTree::getCommonEdges(t1_edges, t2_edges, commonEdges);
//    if (commonEdges.size() != 0) {
//        throw invalid_argument("Error: tried to compute geodesic between subtrees that should not have common edges, but do!  t1 = " + t1.getNewick(true) + " and t2 = " + t2.getNewick(true));
//    }

    auto rs = RatioSequence();
    // if we can't split the ratio because it has too few edges in either the numerator or denominator
    if ((numEdges1 == 1) || (numEdges2 == 1)) {
        rs.push_back_value(Ratio(t1_edges, t2_edges));
        return Geodesic(rs);
    }

    vector<size_t> aVertices, bVertices;
    deque<Ratio> queue;
    Ratio ratio;

    // initialize BipartiteGraph
    auto incidenceMatrix = BipartiteGraph::getIncidenceMatrix(t1_edges, t2_edges);
    BipartiteGraph bg(incidenceMatrix, t1.getIntEdgeAttribNorms(), t2.getIntEdgeAttribNorms());
    queue.emplace_back(t1_edges, t2_edges);
    aVertices.reserve(numEdges1);
    bVertices.reserve(numEdges2);

    while (!queue.empty()) {
        ratio = queue.front();
        queue.pop_front();
        aVertices.clear();
        bVertices.clear();

        // convert the ratio to what we pass to vertex cover
        auto ratio_e_edges = ratio.getEEdges();
        auto ratio_f_edges = ratio.getFEdges();
        for (const auto & ratio_e_edge : ratio_e_edges) {
            auto index_iter = std::lower_bound(t1_edges.begin(), t1_edges.end(), ratio_e_edge);
            aVertices.push_back(std::distance(t1_edges.begin(), index_iter));
        }

        for (int i = 0; i < ratio.getFEdges().size(); i++) {
            auto index_iter = std::lower_bound(t2_edges.begin(), t2_edges.end(), ratio_f_edges[i]);
            bVertices.push_back(std::distance(t2_edges.begin(), index_iter));
        }

        // get the cover
        auto cover = bg.vertex_cover(aVertices, bVertices);
        // check if cover is trivial
        if ((cover[0][0] == 0) || (cover[0][0] == aVertices.size())) {
            // add ratio to geodesic
            rs.push_back(ratio);


        } else {  // cover not trivial
            // make two new ratios
            auto r1 = Ratio();
            auto r2 = Ratio();

            int j = 0;  // for index in cover array

            // split the ratio based on the cover
            for (unsigned long aVertex : aVertices) {
                if ((j < cover[2].size()) && (aVertex == cover[2][j])) {
                    r1.addEEdge(t1_edges[aVertex]);
                    j++;
                } else { // the split is not in the cover, and hence dropped first
                    r2.addEEdge(t1_edges[aVertex]);
                }
            }

            j = 0;   // reset index
            // split the ratio based on the cover
            for (unsigned long bVertex : bVertices) {
                if ((j < cover[3].size()) && (bVertex == cover[3][j])) {
                    r2.addFEdge(t2_edges[bVertex]);
                    j++;
                } else { // the split is not in the cover, and hence dropped first
                    r1.addFEdge(t2_edges[bVertex]);
                }
            }

            // add ratios to the queue
            queue.push_front(r2);
            queue.push_front(r1);
        }
    }
    return Geodesic(rs);
}